

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O3

void enqueue_corner(min_heap *to_expand,node *parent,Pyraminx *pyraminx,Corner *ref_corner,int g)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Direction dir;
  ulong uVar4;
  long local_68;
  value_type local_38;
  
  local_68 = 0;
  do {
    dir = clockwise;
    bVar2 = true;
    do {
      bVar1 = bVar2;
      Pyraminx::turn_layer(pyraminx,*ref_corner,(int)local_68,dir);
      iVar3 = Pyraminx::get_heuristic(pyraminx);
      uVar4 = (ulong)*ref_corner | local_68 << 0x20;
      local_38 = (value_type)operator_new(0x18);
      local_38->cost = iVar3 + g + 1;
      (local_38->to_apply).ref_corner = (int)uVar4;
      (local_38->to_apply).layer = (int)(uVar4 >> 0x20);
      (local_38->to_apply).dir = dir;
      local_38->parent = parent;
      std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::push
                (to_expand,&local_38);
      Pyraminx::turn_layer(pyraminx,*ref_corner,(int)local_68,dir ^ counterclockwise);
      dir = counterclockwise;
      bVar2 = false;
    } while (bVar1);
    local_68 = local_68 + 1;
  } while (local_68 != 4);
  return;
}

Assistant:

void enqueue_corner(min_heap& to_expand, const node* parent, Pyraminx& pyraminx, const Corner& ref_corner, int g){
    // for each possible layer and direction:
    // apply move
    // calculate new f value
    // enqueue new move list and corresponding value
    // undo move
    Direction move_dir;
    Direction undo_dir;
    int h_child;
    int g_child;
    int f_child; 
    for(int layer = 0; layer < 4; layer++){ // iterate layers
        for(int dir = 0; dir < 2; dir++){ // iterate directions
            if(dir == 0){
                move_dir = Direction::clockwise;
                undo_dir = Direction::counterclockwise;
            }
            else{
                move_dir = Direction::counterclockwise;
                undo_dir = Direction::clockwise;
            }
            // Get cost by applying move to pyraminx
            pyraminx.turn_layer(ref_corner, layer, move_dir); 
            h_child = pyraminx.get_heuristic(); 
            g_child = g + 1;
            f_child = g_child + h_child;
            move_type child_move{ .ref_corner=ref_corner, .layer= layer, .dir=move_dir};
        
            // Add to min-heap
            /**std::cout << "Adding node (corner: " << (int) ref_corner <<
                "layer: " << layer << 
                "direction: " << dir <<  
                ") with cost " << f_child << std::endl;
            **/
            to_expand.push(new node(f_child, child_move, parent));
            // Undo test to calculate cost
            pyraminx.turn_layer(ref_corner, layer, undo_dir);
        }
    }
}